

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariable.cpp
# Opt level: O2

void __thiscall
rsg::Variable::tokenizeDeclaration(Variable *this,GeneratorState *state,TokenStream *str)

{
  Version VVar1;
  Type TVar2;
  TokenStream *pTVar3;
  Token local_78;
  Token local_68;
  Token local_58;
  Token local_48;
  Token local_38;
  Token local_28;
  
  if (6 < this->m_storage - STORAGE_SHADER_IN) goto LAB_015deea7;
  VVar1 = state->m_programParams->version;
  switch(this->m_storage) {
  case STORAGE_SHADER_IN:
    if ((int)VVar1 < 1) {
      TVar2 = state->m_shader->m_type;
      if (TVar2 == TYPE_FRAGMENT) {
        local_78.m_type = VARYING;
        pTVar3 = TokenStream::operator<<(str,&local_78);
        local_68.m_type = MEDIUM_PRECISION;
        TokenStream::operator<<(pTVar3,&local_68);
        goto LAB_015dee6f;
      }
      if (TVar2 != TYPE_VERTEX) goto LAB_015deea7;
      local_78.m_type = ATTRIBUTE;
      TokenStream::operator<<(str,&local_78);
    }
    else {
      if (-1 < this->m_layoutLocation) {
        local_78.m_type = LAYOUT;
        pTVar3 = TokenStream::operator<<(str,&local_78);
        local_68.m_type = LEFT_PAREN;
        pTVar3 = TokenStream::operator<<(pTVar3,&local_68);
        local_28.m_type = LOCATION;
        pTVar3 = TokenStream::operator<<(pTVar3,&local_28);
        local_38.m_type = EQUAL;
        pTVar3 = TokenStream::operator<<(pTVar3,&local_38);
        local_48.m_arg.floatValue = (float)this->m_layoutLocation;
        local_48.m_type = INT_LITERAL;
        pTVar3 = TokenStream::operator<<(pTVar3,&local_48);
        local_58.m_type = RIGHT_PAREN;
        TokenStream::operator<<(pTVar3,&local_58);
        Token::~Token(&local_58);
        Token::~Token(&local_48);
        Token::~Token(&local_38);
        Token::~Token(&local_28);
        Token::~Token(&local_68);
        Token::~Token(&local_78);
      }
      local_78.m_type = IN;
      TokenStream::operator<<(str,&local_78);
      Token::~Token(&local_78);
      if (state->m_shader->m_type != TYPE_FRAGMENT) goto LAB_015deea7;
      local_78.m_type = MEDIUM_PRECISION;
      TokenStream::operator<<(str,&local_78);
    }
    break;
  case STORAGE_SHADER_OUT:
    if ((int)VVar1 < 1) {
      if (state->m_shader->m_type != TYPE_VERTEX) goto LAB_015deea7;
      local_78.m_type = VARYING;
      pTVar3 = TokenStream::operator<<(str,&local_78);
      local_68.m_type = MEDIUM_PRECISION;
      TokenStream::operator<<(pTVar3,&local_68);
    }
    else {
      if (-1 < this->m_layoutLocation) {
        local_78.m_type = LAYOUT;
        pTVar3 = TokenStream::operator<<(str,&local_78);
        local_68.m_type = LEFT_PAREN;
        pTVar3 = TokenStream::operator<<(pTVar3,&local_68);
        local_28.m_type = LOCATION;
        pTVar3 = TokenStream::operator<<(pTVar3,&local_28);
        local_38.m_type = EQUAL;
        pTVar3 = TokenStream::operator<<(pTVar3,&local_38);
        local_48.m_arg.floatValue = (float)this->m_layoutLocation;
        local_48.m_type = INT_LITERAL;
        pTVar3 = TokenStream::operator<<(pTVar3,&local_48);
        local_58.m_type = RIGHT_PAREN;
        TokenStream::operator<<(pTVar3,&local_58);
        Token::~Token(&local_58);
        Token::~Token(&local_48);
        Token::~Token(&local_38);
        Token::~Token(&local_28);
        Token::~Token(&local_68);
        Token::~Token(&local_78);
      }
      local_78.m_type = OUT;
      pTVar3 = TokenStream::operator<<(str,&local_78);
      local_68.m_type = MEDIUM_PRECISION;
      TokenStream::operator<<(pTVar3,&local_68);
    }
LAB_015dee6f:
    Token::~Token(&local_68);
    break;
  case STORAGE_UNIFORM:
    local_78.m_type = UNIFORM;
    TokenStream::operator<<(str,&local_78);
    Token::~Token(&local_78);
    if (1 < (this->m_type).m_baseType - TYPE_FLOAT) goto LAB_015deea7;
    local_78.m_type = MEDIUM_PRECISION;
    TokenStream::operator<<(str,&local_78);
    break;
  case STORAGE_CONST:
    local_78.m_type = CONST;
    TokenStream::operator<<(str,&local_78);
    break;
  case STORAGE_PARAMETER_IN:
    local_78.m_type = IN;
    TokenStream::operator<<(str,&local_78);
    break;
  case STORAGE_PARAMETER_OUT:
    local_78.m_type = OUT;
    TokenStream::operator<<(str,&local_78);
    break;
  case STORAGE_PARAMETER_INOUT:
    local_78.m_type = INOUT;
    TokenStream::operator<<(str,&local_78);
  }
  Token::~Token(&local_78);
LAB_015deea7:
  VariableType::tokenizeShortType(&this->m_type,str);
  Token::Token(&local_78,(this->m_name)._M_dataplus._M_p);
  TokenStream::operator<<(str,&local_78);
  Token::~Token(&local_78);
  return;
}

Assistant:

void Variable::tokenizeDeclaration (GeneratorState& state, TokenStream& str) const
{
	Version targetVersion = state.getProgramParameters().version;

	// \todo [2011-03-10 pyry] Remove precision hacks once precision handling is implemented
	switch (m_storage)
	{
		case STORAGE_CONST:				str << Token::CONST;		break;
		case STORAGE_PARAMETER_IN:		str << Token::IN;			break;
		case STORAGE_PARAMETER_OUT:		str << Token::OUT;			break;
		case STORAGE_PARAMETER_INOUT:	str << Token::INOUT;		break;

		case STORAGE_UNIFORM:
		{
			str << Token::UNIFORM;
			if (m_type.isFloatOrVec() || m_type.isIntOrVec())
				str << Token::MEDIUM_PRECISION;
			break;
		}

		case STORAGE_SHADER_IN:
		{
			if (targetVersion >= VERSION_300)
			{
				if (hasLayoutLocation())
					str << Token::LAYOUT << Token::LEFT_PAREN << Token::LOCATION << Token::EQUAL << m_layoutLocation << Token::RIGHT_PAREN;

				str << Token::IN;

				if (state.getShader().getType() == Shader::TYPE_FRAGMENT)
					str << Token::MEDIUM_PRECISION;
			}
			else
			{
				DE_ASSERT(!hasLayoutLocation());

				switch (state.getShader().getType())
				{
					case Shader::TYPE_VERTEX:	str << Token::ATTRIBUTE;								break;
					case Shader::TYPE_FRAGMENT:	str << Token::VARYING << Token::MEDIUM_PRECISION;		break;
					default:					DE_ASSERT(DE_FALSE);									break;
				}
			}
			break;
		}

		case STORAGE_SHADER_OUT:
		{
			if (targetVersion >= VERSION_300)
			{
				if (hasLayoutLocation())
					str << Token::LAYOUT << Token::LEFT_PAREN << Token::LOCATION << Token::EQUAL << m_layoutLocation << Token::RIGHT_PAREN;

				str << Token::OUT << Token::MEDIUM_PRECISION;
			}
			else
			{
				DE_ASSERT(!hasLayoutLocation());

				if (state.getShader().getType() == Shader::TYPE_VERTEX)
					str << Token::VARYING << Token::MEDIUM_PRECISION;
				else
					DE_ASSERT(DE_FALSE);
			}
			break;
		}

		case STORAGE_LOCAL:
		default:
			/* nothing */
			break;
	}

	m_type.tokenizeShortType(str);

	DE_ASSERT(m_name != "");
	str << Token(m_name.c_str());
}